

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O0

void __thiscall duckdb_shell::ModeJsonRenderer::RenderRow(ModeJsonRenderer *this,RowResult *result)

{
  bool bVar1;
  int iVar2;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_00;
  vector<const_char_*,_std::allocator<const_char_*>_> *this_01;
  size_type sVar3;
  reference ppcVar4;
  reference pvVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RSI;
  long in_RDI;
  int nBlob;
  void *pBlob;
  idx_t i;
  vector<const_char_*,_std::allocator<const_char_*>_> *col_names;
  vector<int,_std::allocator<int>_> *types;
  vector<const_char_*,_std::allocator<const_char_*>_> *data;
  int in_stack_000000b4;
  sqlite3_stmt *in_stack_000000b8;
  char *in_stack_ffffffffffffff88;
  ShellState *in_stack_ffffffffffffff90;
  sqlite3_stmt *in_stack_ffffffffffffff98;
  ShellState *in_stack_ffffffffffffffa0;
  ulong local_30;
  
  this_00 = in_RSI + 1;
  this_01 = in_RSI + 2;
  for (local_30 = 0; sVar3 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RSI),
      local_30 < sVar3; local_30 = local_30 + 1) {
    if (local_30 != 0) {
      ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](in_RSI,local_30);
    ShellState::OutputJSONString
              (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
               (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
    ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](this_00,local_30)
    ;
    if ((*ppcVar4 == (value_type)0x0) ||
       ((bVar1 = std::vector<int,_std::allocator<int>_>::empty
                           ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0), !bVar1
        && (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)this_01,local_30), *pvVar5 == 5
           )))) {
      ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      bVar1 = std::vector<int,_std::allocator<int>_>::empty
                        ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0);
      if ((bVar1) ||
         (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)this_01,local_30), *pvVar5 != 2))
      {
        bVar1 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0);
        if ((bVar1) ||
           ((pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)this_01,local_30),
            *pvVar5 != 4 ||
            (in_RSI[3].super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
             super__Vector_impl_data._M_start == (pointer)0x0)))) {
          bVar1 = std::vector<int,_std::allocator<int>_>::empty
                            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffa0);
          if ((bVar1) ||
             (pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)this_01,local_30),
             *pvVar5 != 3)) {
            in_stack_ffffffffffffff90 = *(ShellState **)(in_RDI + 8);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](this_00,local_30);
            ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          }
          else {
            in_stack_ffffffffffffff98 = *(sqlite3_stmt **)(in_RDI + 8);
            std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[](this_00,local_30);
            ShellState::OutputJSONString
                      (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                       (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
          }
        }
        else {
          duckdb_shell_sqlite3_column_blob(in_stack_000000b8,in_stack_000000b4);
          duckdb_shell_sqlite3_column_bytes
                    (in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
          ShellState::OutputJSONString
                    (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20));
        }
      }
      else {
        ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                            (this_00,local_30);
        iVar2 = strcmp(*ppcVar4,"inf");
        if (iVar2 == 0) {
          ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        }
        else {
          ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                              (this_00,local_30);
          iVar2 = strcmp(*ppcVar4,"-inf");
          if (iVar2 == 0) {
            ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          }
          else {
            ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                (this_00,local_30);
            iVar2 = strcmp(*ppcVar4,"nan");
            if (iVar2 == 0) {
              ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
            }
            else {
              ppcVar4 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                                  (this_00,local_30);
              iVar2 = strcmp(*ppcVar4,"-nan");
              if (iVar2 == 0) {
                ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
              }
              else {
                in_stack_ffffffffffffffa0 = *(ShellState **)(in_RDI + 8);
                std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (this_00,local_30);
                ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
              }
            }
          }
        }
      }
    }
  }
  ShellState::Print(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void RenderRow(RowResult &result) override {
		auto &data = result.data;
		auto &types = result.types;
		auto &col_names = result.column_names;
		for (idx_t i = 0; i < col_names.size(); i++) {
			if (i > 0) {
				state.Print(",");
			}
			state.OutputJSONString(col_names[i], -1);
			state.Print(":");
			if ((data[i] == 0) || (!types.empty() && types[i] == SQLITE_NULL)) {
				state.Print("null");
			} else if (!types.empty() && types[i] == SQLITE_FLOAT) {
				if (strcmp(data[i], "inf") == 0) {
					state.Print("1e999");
				} else if (strcmp(data[i], "-inf") == 0) {
					state.Print("-1e999");
				} else if (strcmp(data[i], "nan") == 0) {
					state.Print("null");
				} else if (strcmp(data[i], "-nan") == 0) {
					state.Print("null");
				} else {
					state.Print(data[i]);
				}
			} else if (!types.empty() && types[i] == SQLITE_BLOB && result.pStmt) {
				const void *pBlob = sqlite3_column_blob(result.pStmt, i);
				int nBlob = sqlite3_column_bytes(result.pStmt, i);
				state.OutputJSONString((const char *)pBlob, nBlob);
			} else if (!types.empty() && types[i] == SQLITE_TEXT) {
				state.OutputJSONString(data[i], -1);
			} else {
				state.Print(data[i]);
			}
		}
		state.Print("}");
	}